

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zcc_parser.cpp
# Opt level: O2

ZCC_TreeNode * __thiscall
ZCC_AST::InitNode(ZCC_AST *this,size_t size,EZCCTreeNodeType type,ZCC_TreeNode *basis)

{
  int iVar1;
  ZCC_TreeNode *pZVar2;
  
  pZVar2 = (ZCC_TreeNode *)FMemArena::Alloc(&this->SyntaxArena,size);
  pZVar2->SiblingNext = pZVar2;
  pZVar2->SiblingPrev = pZVar2;
  pZVar2->NodeType = type;
  if (basis != (ZCC_TreeNode *)0x0) {
    pZVar2->SourceName = basis->SourceName;
    iVar1 = basis->SourceLoc;
    pZVar2->SourceLump = basis->SourceLump;
    pZVar2->SourceLoc = iVar1;
  }
  return pZVar2;
}

Assistant:

ZCC_TreeNode *ZCC_AST::InitNode(size_t size, EZCCTreeNodeType type, ZCC_TreeNode *basis)
{
	ZCC_TreeNode *node = (ZCC_TreeNode *)SyntaxArena.Alloc(size);
	node->SiblingNext = node;
	node->SiblingPrev = node;
	node->NodeType = type;
	if (basis != NULL)
	{
		node->SourceName = basis->SourceName;
		node->SourceLump = basis->SourceLump;
		node->SourceLoc = basis->SourceLoc;
	}
	return node;
}